

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePop(void)

{
  bool bVar1;
  uint uVar2;
  int unaff_retaddr;
  ImU32 tree_depth_mask;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  
  this = GImGui->CurrentWindow;
  pIVar3 = GImGui;
  Unindent((float)tree_depth_mask);
  (this->DC).TreeDepth = (this->DC).TreeDepth + -1;
  uVar2 = 1 << ((byte)(this->DC).TreeDepth & 0x1f);
  if ((((pIVar3->NavMoveDir == 0) && (pIVar3->NavWindow == this)) &&
      (bVar1 = NavMoveRequestButNoResultYet(), bVar1)) &&
     (((pIVar3->NavIdIsAlive & 1U) != 0 && (((this->DC).TreeJumpToParentOnPopMask & uVar2) != 0))))
  {
    ImVector<unsigned_int>::back((ImVector<unsigned_int> *)this);
    SetNavID(tree_depth_mask,unaff_retaddr,(ImGuiID)((ulong)pIVar3 >> 0x20));
    NavMoveRequestCancel();
  }
  (this->DC).TreeJumpToParentOnPopMask = uVar2 - 1 & (this->DC).TreeJumpToParentOnPopMask;
  if ((this->IDStack).Size < 2) {
    __assert_fail("window->IDStack.Size > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x15ca,"void ImGui::TreePop()");
  }
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    ImU32 tree_depth_mask = (1 << window->DC.TreeDepth);

    // Handle Left arrow to move to parent tree node (when ImGuiTreeNodeFlags_NavLeftJumpsBackHere is enabled)
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeJumpToParentOnPopMask & tree_depth_mask))
        {
            SetNavID(window->IDStack.back(), g.NavLayer, 0);
            NavMoveRequestCancel();
        }
    window->DC.TreeJumpToParentOnPopMask &= tree_depth_mask - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}